

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_atof.h
# Opt level: O1

uint64_t __thiscall Assimp::strtoul10_64(Assimp *this,char *in,char **out,uint *max_inout)

{
  Assimp AVar1;
  bool bVar2;
  Logger *this_00;
  ostream *poVar3;
  invalid_argument *this_01;
  long *plVar4;
  long *plVar5;
  int iVar6;
  uint *puVar7;
  uint *puVar8;
  Assimp *local_1f8;
  char *local_1f0;
  long *local_1e8;
  long local_1e0;
  long local_1d8;
  long lStack_1d0;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  ios_base local_138 [264];
  
  local_1f8 = this;
  local_1f0 = in;
  if ((byte)((char)*this - 0x3aU) < 0xf6) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    local_1c8[0] = local_1b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"The string \"","");
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1c8);
    local_1e8 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_1e8 == plVar5) {
      local_1d8 = *plVar5;
      lStack_1d0 = plVar4[3];
      local_1e8 = &local_1d8;
    }
    else {
      local_1d8 = *plVar5;
    }
    local_1e0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_1e8);
    local_1a8 = (long *)*plVar4;
    plVar5 = plVar4 + 2;
    if (local_1a8 == plVar5) {
      local_198 = *plVar5;
      lStack_190 = plVar4[3];
      local_1a8 = &local_198;
    }
    else {
      local_198 = *plVar5;
    }
    local_1a0 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::invalid_argument::invalid_argument(this_01,(string *)&local_1a8);
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  iVar6 = 0;
  puVar7 = (uint *)0x0;
  do {
    if ((byte)((char)*local_1f8 - 0x3aU) < 0xf6) {
      if (local_1f0 != (char *)0x0) {
        *(Assimp **)local_1f0 = local_1f8;
      }
      if (out == (char **)0x0) {
        return (uint64_t)puVar7;
      }
      *(int *)out = iVar6;
      return (uint64_t)puVar7;
    }
    puVar8 = (uint *)((ulong)(byte)((char)*local_1f8 - 0x30) + (long)puVar7 * 10);
    if (puVar8 < puVar7) {
      this_00 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[24]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8,
                 (char (*) [24])"Converting the string \"");
      poVar3 = (ostream *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1a8,(char **)&local_1f8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"\" into a value resulted in overflow.",0x24);
      std::__cxx11::stringbuf::str();
      Logger::warn(this_00,(char *)local_1e8);
      if (local_1e8 != &local_1d8) {
        operator_delete(local_1e8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar2 = false;
      max_inout = (uint *)0x0;
      puVar8 = puVar7;
    }
    else {
      local_1f8 = local_1f8 + 1;
      iVar6 = iVar6 + 1;
      bVar2 = true;
      if ((out != (char **)0x0) && (*(int *)out == iVar6)) {
        if (local_1f0 != (char *)0x0) {
          AVar1 = *local_1f8;
          while ((byte)((char)AVar1 - 0x30U) < 10) {
            local_1f8 = local_1f8 + 1;
            AVar1 = *local_1f8;
          }
          *(Assimp **)local_1f0 = local_1f8;
        }
        bVar2 = false;
        max_inout = puVar8;
      }
    }
    puVar7 = puVar8;
  } while (bVar2);
  return (uint64_t)max_inout;
}

Assistant:

inline
uint64_t strtoul10_64( const char* in, const char** out=0, unsigned int* max_inout=0) {
    unsigned int cur = 0;
    uint64_t value = 0;

    if ( *in < '0' || *in > '9' ) {
        throw std::invalid_argument( std::string( "The string \"" ) + in + "\" cannot be converted into a value." );
    }

    for ( ;; ) {
        if ( *in < '0' || *in > '9' ) {
            break;
        }

        const uint64_t new_value = ( value * (uint64_t) 10 ) + ( (uint64_t) ( *in - '0' ) );

        // numeric overflow, we rely on you
        if ( new_value < value ) {
            ASSIMP_LOG_WARN_F( "Converting the string \"", in, "\" into a value resulted in overflow." );
            return 0;
        }

        value = new_value;

        ++in;
        ++cur;

        if (max_inout && *max_inout == cur) {
            if (out) { /* skip to end */
                while ( *in >= '0' && *in <= '9' ) {
                    ++in;
                }
                *out = in;
            }

            return value;
        }
    }
    if ( out ) {
        *out = in;
    }

    if ( max_inout ) {
        *max_inout = cur;
    }

    return value;
}